

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_stream_close(nghttp2_session *session,int32_t stream_id,uint32_t error_code,void *userp)

{
  int iVar1;
  char *pcVar2;
  stream_ctx *local_68;
  Curl_easy *local_60;
  Curl_easy *local_58;
  int rv;
  stream_ctx *stream;
  Curl_easy *call_data;
  Curl_easy *data_s;
  Curl_cfilter *cf;
  void *userp_local;
  uint32_t error_code_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (userp == (void *)0x0) {
    local_58 = (Curl_easy *)0x0;
  }
  else {
    local_58 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
  }
  if (stream_id == 0) {
    local_60 = (Curl_easy *)0x0;
  }
  else {
    local_60 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  }
  if (local_60 == (Curl_easy *)0x0) {
    if ((((local_58 != (Curl_easy *)0x0) &&
         ((*(ulong *)&(local_58->set).field_0x8ba >> 0x1c & 1) != 0)) && (userp != (void *)0x0)) &&
       (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(local_58,(Curl_cfilter *)userp,"[%d] on_stream_close, no easy set on stream"
                        ,(ulong)(uint)stream_id);
    }
    session_local._4_4_ = 0;
  }
  else if ((local_60 == (Curl_easy *)0x0) || (local_60->magic != 0xc0dedbad)) {
    if ((local_58 != (Curl_easy *)0x0) &&
       ((((*(ulong *)&(local_58->set).field_0x8ba >> 0x1c & 1) != 0 && (userp != (void *)0x0)) &&
        (0 < *(int *)(*userp + 0xc))))) {
      Curl_trc_cf_infof(local_58,(Curl_cfilter *)userp,
                        "[%d] on_stream_close, not a GOOD easy on stream",(ulong)(uint)stream_id);
    }
    nghttp2_session_set_stream_user_data(session,stream_id,(void *)0x0);
    session_local._4_4_ = -0x386;
  }
  else {
    if ((local_60 == (Curl_easy *)0x0) || ((local_60->req).p.file == (FILEPROTO *)0x0)) {
      local_68 = (stream_ctx *)0x0;
    }
    else {
      local_68 = (stream_ctx *)(((local_60->req).p.rtsp)->http_wrapper).h2_ctx;
    }
    if (local_68 == (stream_ctx *)0x0) {
      if (((local_60 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(local_60->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
        Curl_trc_cf_infof(local_60,(Curl_cfilter *)userp,
                          "[%d] on_stream_close, GOOD easy but no stream",(ulong)(uint)stream_id);
      }
      session_local._4_4_ = -0x386;
    }
    else {
      local_68->closed = true;
      local_68->error = error_code;
      if (local_68->error != 0) {
        local_68->reset = true;
        local_68->send_closed = true;
      }
      if (local_68->error == 0) {
        if (((local_60 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(local_60->set).field_0x8ba >> 0x1c & 1) != 0)) &&
           ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
          Curl_trc_cf_infof(local_60,(Curl_cfilter *)userp,"[%d] CLOSED",(ulong)(uint)stream_id);
        }
      }
      else if ((((local_60 != (Curl_easy *)0x0) &&
                ((*(ulong *)&(local_60->set).field_0x8ba >> 0x1c & 1) != 0)) &&
               (userp != (void *)0x0)) && (0 < *(int *)(*userp + 0xc))) {
        pcVar2 = nghttp2_http2_strerror(error_code);
        Curl_trc_cf_infof(local_60,(Curl_cfilter *)userp,"[%d] RESET: %s (err %d)",
                          (ulong)(uint)stream_id,pcVar2,(ulong)error_code);
      }
      drain_stream((Curl_cfilter *)userp,local_60,local_68);
      iVar1 = nghttp2_session_set_stream_user_data(session,stream_id,(void *)0x0);
      if (((iVar1 != 0) && (local_60 != (Curl_easy *)0x0)) &&
         ((*(ulong *)&(local_60->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(local_60,"http/2: failed to clear user_data for stream %u",(ulong)(uint)stream_id
                  );
      }
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_stream_close(nghttp2_session *session, int32_t stream_id,
                           uint32_t error_code, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct Curl_easy *data_s, *call_data = CF_DATA_CURRENT(cf);
  struct stream_ctx *stream;
  int rv;
  (void)session;

  DEBUGASSERT(call_data);
  /* get the stream from the hash based on Stream ID, stream ID zero is for
     connection-oriented stuff */
  data_s = stream_id?
             nghttp2_session_get_stream_user_data(session, stream_id) : NULL;
  if(!data_s) {
    CURL_TRC_CF(call_data, cf,
                "[%d] on_stream_close, no easy set on stream", stream_id);
    return 0;
  }
  if(!GOOD_EASY_HANDLE(data_s)) {
    /* nghttp2 still has an easy registered for the stream which has
     * been freed be libcurl. This points to a code path that does not
     * trigger DONE or DETACH events as it must. */
    CURL_TRC_CF(call_data, cf,
                "[%d] on_stream_close, not a GOOD easy on stream", stream_id);
    (void)nghttp2_session_set_stream_user_data(session, stream_id, 0);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  stream = H2_STREAM_CTX(data_s);
  if(!stream) {
    CURL_TRC_CF(data_s, cf,
                "[%d] on_stream_close, GOOD easy but no stream", stream_id);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  stream->closed = TRUE;
  stream->error = error_code;
  if(stream->error) {
    stream->reset = TRUE;
    stream->send_closed = TRUE;
  }

  if(stream->error)
    CURL_TRC_CF(data_s, cf, "[%d] RESET: %s (err %d)",
              stream_id, nghttp2_http2_strerror(error_code), error_code);
  else
    CURL_TRC_CF(data_s, cf, "[%d] CLOSED", stream_id);
  drain_stream(cf, data_s, stream);

  /* remove `data_s` from the nghttp2 stream */
  rv = nghttp2_session_set_stream_user_data(session, stream_id, 0);
  if(rv) {
    infof(data_s, "http/2: failed to clear user_data for stream %u",
          stream_id);
    DEBUGASSERT(0);
  }
  return 0;
}